

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

ConditionalPathDeclarationSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ConditionalPathDeclarationSyntax,slang::syntax::ConditionalPathDeclarationSyntax_const&>
          (BumpAllocator *this,ConditionalPathDeclarationSyntax *args)

{
  SyntaxNode *pSVar1;
  size_t sVar2;
  Info *pIVar3;
  Info *pIVar4;
  ExpressionSyntax *pEVar5;
  PathDeclarationSyntax *pPVar6;
  undefined4 uVar7;
  TokenKind TVar8;
  undefined1 uVar9;
  NumericTokenFlags NVar10;
  uint32_t uVar11;
  TokenKind TVar12;
  undefined1 uVar13;
  NumericTokenFlags NVar14;
  uint32_t uVar15;
  TokenKind TVar16;
  undefined1 uVar17;
  NumericTokenFlags NVar18;
  uint32_t uVar19;
  ConditionalPathDeclarationSyntax *pCVar20;
  
  pCVar20 = (ConditionalPathDeclarationSyntax *)allocate(this,0x90,8);
  uVar7 = *(undefined4 *)&(args->super_MemberSyntax).super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_MemberSyntax).super_SyntaxNode.parent;
  (pCVar20->super_MemberSyntax).super_SyntaxNode.kind =
       (args->super_MemberSyntax).super_SyntaxNode.kind;
  *(undefined4 *)&(pCVar20->super_MemberSyntax).super_SyntaxNode.field_0x4 = uVar7;
  (pCVar20->super_MemberSyntax).super_SyntaxNode.parent = pSVar1;
  (pCVar20->super_MemberSyntax).super_SyntaxNode.previewNode =
       (args->super_MemberSyntax).super_SyntaxNode.previewNode;
  uVar7 = *(undefined4 *)
           &(args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent;
  (pCVar20->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind =
       (args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind;
  *(undefined4 *)
   &(pCVar20->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar7
  ;
  (pCVar20->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (pCVar20->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.previewNode;
  (pCVar20->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_00596408;
  (pCVar20->super_MemberSyntax).attributes.super_SyntaxListBase.childCount =
       (args->super_MemberSyntax).attributes.super_SyntaxListBase.childCount;
  sVar2 = (args->super_MemberSyntax).attributes.
          super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  (pCVar20->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr =
       (args->super_MemberSyntax).attributes.
       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
  (pCVar20->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = sVar2;
  (pCVar20->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_005968d0;
  TVar16 = (args->keyword).kind;
  uVar17 = (args->keyword).field_0x2;
  NVar18.raw = (args->keyword).numFlags.raw;
  uVar19 = (args->keyword).rawLen;
  pIVar3 = (args->keyword).info;
  TVar12 = (args->openParen).kind;
  uVar13 = (args->openParen).field_0x2;
  NVar14.raw = (args->openParen).numFlags.raw;
  uVar15 = (args->openParen).rawLen;
  pIVar4 = (args->openParen).info;
  pEVar5 = (args->predicate).ptr;
  TVar8 = (args->closeParen).kind;
  uVar9 = (args->closeParen).field_0x2;
  NVar10.raw = (args->closeParen).numFlags.raw;
  uVar11 = (args->closeParen).rawLen;
  pPVar6 = (args->path).ptr;
  (pCVar20->closeParen).info = (args->closeParen).info;
  (pCVar20->path).ptr = pPVar6;
  (pCVar20->predicate).ptr = pEVar5;
  (pCVar20->closeParen).kind = TVar8;
  (pCVar20->closeParen).field_0x2 = uVar9;
  (pCVar20->closeParen).numFlags = (NumericTokenFlags)NVar10.raw;
  (pCVar20->closeParen).rawLen = uVar11;
  (pCVar20->openParen).kind = TVar12;
  (pCVar20->openParen).field_0x2 = uVar13;
  (pCVar20->openParen).numFlags = (NumericTokenFlags)NVar14.raw;
  (pCVar20->openParen).rawLen = uVar15;
  (pCVar20->openParen).info = pIVar4;
  (pCVar20->keyword).kind = TVar16;
  (pCVar20->keyword).field_0x2 = uVar17;
  (pCVar20->keyword).numFlags = (NumericTokenFlags)NVar18.raw;
  (pCVar20->keyword).rawLen = uVar19;
  (pCVar20->keyword).info = pIVar3;
  return pCVar20;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }